

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

aom_codec_err_t
aom_get_num_layers_from_operating_point_idc
          (int operating_point_idc,uint *number_spatial_layers,uint *number_temporal_layers)

{
  int j_1;
  int j;
  uint *number_temporal_layers_local;
  uint *number_spatial_layers_local;
  int operating_point_idc_local;
  undefined4 local_4;
  
  if ((number_spatial_layers == (uint *)0x0) || (number_temporal_layers == (uint *)0x0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (operating_point_idc == 0) {
      *number_temporal_layers = 1;
      *number_spatial_layers = 1;
    }
    else {
      *number_spatial_layers = 0;
      *number_temporal_layers = 0;
      for (j = 0; j < 4; j = j + 1) {
        *number_spatial_layers =
             (operating_point_idc >> ((char)j + 8U & 0x1f) & 1U) + *number_spatial_layers;
      }
      for (j_1 = 0; j_1 < 8; j_1 = j_1 + 1) {
        *number_temporal_layers =
             (operating_point_idc >> ((byte)j_1 & 0x1f) & 1U) + *number_temporal_layers;
      }
    }
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_get_num_layers_from_operating_point_idc(
    int operating_point_idc, unsigned int *number_spatial_layers,
    unsigned int *number_temporal_layers) {
  // derive number of spatial/temporal layers from operating_point_idc

  if (!number_spatial_layers || !number_temporal_layers)
    return AOM_CODEC_INVALID_PARAM;

  if (operating_point_idc == 0) {
    *number_temporal_layers = 1;
    *number_spatial_layers = 1;
  } else {
    *number_spatial_layers = 0;
    *number_temporal_layers = 0;
    for (int j = 0; j < MAX_NUM_SPATIAL_LAYERS; j++) {
      *number_spatial_layers +=
          (operating_point_idc >> (j + MAX_NUM_TEMPORAL_LAYERS)) & 0x1;
    }
    for (int j = 0; j < MAX_NUM_TEMPORAL_LAYERS; j++) {
      *number_temporal_layers += (operating_point_idc >> j) & 0x1;
    }
  }

  return AOM_CODEC_OK;
}